

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void util_tests::TestAddMatrixOverflow<int>(void)

{
  bool bVar1;
  long in_FS_OFFSET;
  int MAXI;
  char *in_stack_fffffffffffff928;
  lazy_ostream *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  size_t in_stack_fffffffffffff958;
  size_t line_num;
  const_string *in_stack_fffffffffffff960;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff968;
  unit_test_log_t *this;
  lazy_ostream local_490;
  undefined1 local_478 [32];
  unit_test_log_t local_458 [2];
  const_string local_448;
  lazy_ostream local_434;
  undefined1 local_420 [68];
  lazy_ostream local_3dc;
  undefined1 local_3c8 [64];
  lazy_ostream local_388;
  undefined1 local_370 [68];
  undefined4 local_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [64];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [64];
  undefined1 local_288 [16];
  undefined1 local_278 [68];
  undefined4 local_234;
  undefined1 local_230 [16];
  undefined1 local_220 [68];
  lazy_ostream local_1dc;
  undefined1 local_1c8 [68];
  lazy_ostream local_184;
  undefined1 local_170 [64];
  const_string local_130 [2];
  lazy_ostream local_110 [2];
  assertion_result local_f0 [2];
  const_string local_b8 [2];
  lazy_ostream local_98 [2];
  assertion_result local_78 [2];
  undefined4 local_3c;
  _Optional_payload_base<int> local_38;
  _Optional_payload_base<int> local_30;
  _Optional_payload_base<int> local_28;
  _Optional_payload_base<int> local_20;
  _Optional_payload_base<int> local_18;
  _Optional_payload_base<int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0x7fffffff;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_10 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    std::optional::operator_cast_to_bool((optional<int> *)in_stack_fffffffffffff928);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff938,
               SUB81((ulong)in_stack_fffffffffffff930 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff930,(basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    in_stack_fffffffffffff928 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_78,local_98,local_b8,0x245,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff928);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_18 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    std::optional::operator_cast_to_bool((optional<int> *)in_stack_fffffffffffff928);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff938,
               SUB81((ulong)in_stack_fffffffffffff930 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff930,(basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    in_stack_fffffffffffff928 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f0,local_110,local_130,0x246,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff928);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_184._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(T{1}, MAXI)";
    in_stack_fffffffffffff930 = &local_184;
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_170,(undefined1 *)((long)&local_184._vptr_lazy_ostream + 4),0x247,1,2,&local_3c
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_1dc._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(MAXI, MAXI)";
    in_stack_fffffffffffff930 = &local_1dc;
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1c8,(undefined1 *)((long)&local_1dc._vptr_lazy_ostream + 4),0x248,1,2,&local_3c
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_234 = 0;
    local_20 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    in_stack_fffffffffffff930 =
         (lazy_ostream *)std::optional<int>::value((optional<int> *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 = "CheckedAdd(T{0}, T{0}).value()";
    in_stack_fffffffffffff928 = "0";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_220,local_230,0x24a,1,2,&local_234);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_28 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    in_stack_fffffffffffff930 =
         (lazy_ostream *)std::optional<int>::value((optional<int> *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 = "CheckedAdd(T{0}, MAXI).value()";
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_278,local_288,0x24b,1,2,&local_3c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_30 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    in_stack_fffffffffffff930 =
         (lazy_ostream *)std::optional<int>::value((optional<int> *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 = "CheckedAdd(T{1}, MAXI - 1).value()";
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_2c8,local_2d8,0x24c,1,2,&local_3c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_32c = 0x7ffffffe;
    local_38 = (_Optional_payload_base<int>)
               CheckedAdd<int>((int)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    in_stack_fffffffffffff930 =
         (lazy_ostream *)std::optional<int>::value((optional<int> *)in_stack_fffffffffffff938);
    in_stack_fffffffffffff938 = "CheckedAdd(T{1}, MAXI - 2).value()";
    in_stack_fffffffffffff928 = "MAXI - 1";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_318,local_328,0x24d,1,2,&local_32c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_388._vptr_lazy_ostream._4_4_ = 0;
    local_388._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(T{0}, T{0})";
    in_stack_fffffffffffff930 = &local_388;
    in_stack_fffffffffffff928 = "0";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_370,&local_388.m_empty,0x24e,1,2,
               (undefined1 *)((long)&local_388._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_3dc._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(T{0}, MAXI)";
    in_stack_fffffffffffff930 = &local_3dc;
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_3c8,(undefined1 *)((long)&local_3dc._vptr_lazy_ostream + 4),0x24f,1,2,&local_3c
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_434._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(T{1}, MAXI - 1)";
    in_stack_fffffffffffff930 = &local_434;
    in_stack_fffffffffffff928 = "MAXI";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_420,(undefined1 *)((long)&local_434._vptr_lazy_ostream + 4),0x250,1,2,&local_3c
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_448;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    this = local_458;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,line_num,
               (const_string *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    local_490._vptr_lazy_ostream._4_4_ = 0x7ffffffe;
    in_stack_fffffffffffff954 = 1;
    local_490._vptr_lazy_ostream._0_4_ =
         SaturatingAdd<int>((int)in_stack_fffffffffffff938,
                            (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
    in_stack_fffffffffffff938 = "SaturatingAdd(T{1}, MAXI - 2)";
    in_stack_fffffffffffff930 = &local_490;
    in_stack_fffffffffffff928 = "MAXI - 1";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_478,&local_490.m_empty,0x251,in_stack_fffffffffffff954,2,
               (undefined1 *)((long)&local_490._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestAddMatrixOverflow()
{
    constexpr T MAXI{std::numeric_limits<T>::max()};
    BOOST_CHECK(!CheckedAdd(T{1}, MAXI));
    BOOST_CHECK(!CheckedAdd(MAXI, MAXI));
    BOOST_CHECK_EQUAL(MAXI, SaturatingAdd(T{1}, MAXI));
    BOOST_CHECK_EQUAL(MAXI, SaturatingAdd(MAXI, MAXI));

    BOOST_CHECK_EQUAL(0, CheckedAdd(T{0}, T{0}).value());
    BOOST_CHECK_EQUAL(MAXI, CheckedAdd(T{0}, MAXI).value());
    BOOST_CHECK_EQUAL(MAXI, CheckedAdd(T{1}, MAXI - 1).value());
    BOOST_CHECK_EQUAL(MAXI - 1, CheckedAdd(T{1}, MAXI - 2).value());
    BOOST_CHECK_EQUAL(0, SaturatingAdd(T{0}, T{0}));
    BOOST_CHECK_EQUAL(MAXI, SaturatingAdd(T{0}, MAXI));
    BOOST_CHECK_EQUAL(MAXI, SaturatingAdd(T{1}, MAXI - 1));
    BOOST_CHECK_EQUAL(MAXI - 1, SaturatingAdd(T{1}, MAXI - 2));
}